

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

bool __thiscall kj::anon_unknown_36::HttpInputStreamImpl::isCleanDrain(HttpInputStreamImpl *this)

{
  bool bVar1;
  
  if ((this->onMessageDone).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
    return false;
  }
  snarfBufferedLineBreak(this);
  if (this->lineBreakBeforeNextHeader == false) {
    bVar1 = (this->leftover).size_ == 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool operator==(kj::None) const { return ptr == nullptr; }